

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftmgr.c
# Opt level: O2

void ftmgr_timedout(ftmgr *ftmgr)

{
  byte bVar1;
  char cVar2;
  int i;
  long lVar3;
  uint uVar4;
  uint uVar5;
  __ftb *p_Var6;
  char cVar7;
  char cVar8;
  
  bVar1 = ftmgr->bitmap;
  uVar5 = 0xffffffff;
  cVar7 = '\0';
  p_Var6 = ftmgr->ftq;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    cVar8 = p_Var6->tts + -1;
    cVar2 = cVar8;
    if (cVar7 < cVar8) {
      cVar2 = cVar7;
    }
    uVar4 = uVar5;
    if (cVar8 < cVar7) {
      uVar4 = (uint)lVar3;
    }
    p_Var6->tts = cVar8;
    if ((bVar1 >> ((uint)lVar3 & 0x1f) & 1) == 0) {
      cVar7 = cVar2;
      uVar5 = uVar4;
    }
    p_Var6 = p_Var6 + 1;
  }
  if (uVar5 == 0xffffffff) {
    return;
  }
  ftmgr->ftq[(int)uVar5].tts = ftmgr->tts;
  fm_write(ftmgr->chmgr,(char)uVar5 + ' ',ftmgr->ftq[(int)uVar5].blk,ftmgr->ftq[(int)uVar5].size);
  return;
}

Assistant:

void ftmgr_timedout(struct ftmgr *ftmgr)
{
    int seq = -1, tts = 0;
    for(int i = 0;i < FTQ_NR;i++) {
        ftmgr->ftq[i].tts--;
        if(!(ftmgr->bitmap & (1 << i)) && ftmgr->ftq[i].tts < tts) {
            seq = i;
            tts = ftmgr->ftq[i].tts;
        }
    }

    if(seq != -1) {
        ftmgr->ftq[seq].tts = ftmgr->tts;
        fm_write(ftmgr->chmgr, CTRL_BLK_SEQ0 + seq, ftmgr->ftq[seq].blk, ftmgr->ftq[seq].size);
    }
}